

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBench.c
# Opt level: O0

int Io_WriteBenchLut(Abc_Ntk_t *pNtk,char *pFileName)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  Abc_Ntk_t *pAVar4;
  FILE *pFile;
  Abc_Ntk_t *pExdc;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsAigNetlist(pNtk);
  if (iVar2 != 0) {
    iVar2 = Io_WriteBenchCheckNames(pNtk);
    if (iVar2 == 0) {
      fprintf(_stdout,
              "Io_WriteBenchLut(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n"
             );
      pNtk_local._4_4_ = 0;
    }
    else {
      __stream = fopen(pFileName,"w");
      if (__stream == (FILE *)0x0) {
        fprintf(_stdout,"Io_WriteBench(): Cannot open the output file.\n");
        pNtk_local._4_4_ = 0;
      }
      else {
        pcVar1 = pNtk->pName;
        pcVar3 = Extra_TimeStamp();
        fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar3);
        Io_WriteBenchLutOne((FILE *)__stream,pNtk);
        pAVar4 = Abc_NtkExdc(pNtk);
        if (pAVar4 != (Abc_Ntk_t *)0x0) {
          printf("Io_WriteBench: EXDC is not written (warning).\n");
        }
        fclose(__stream);
        pNtk_local._4_4_ = 1;
      }
    }
    return pNtk_local._4_4_;
  }
  __assert_fail("Abc_NtkIsAigNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                ,0xb3,"int Io_WriteBenchLut(Abc_Ntk_t *, char *)");
}

Assistant:

int Io_WriteBenchLut( Abc_Ntk_t * pNtk, char * pFileName )
{
    Abc_Ntk_t * pExdc;
    FILE * pFile;
    assert( Abc_NtkIsAigNetlist(pNtk) );
    if ( !Io_WriteBenchCheckNames(pNtk) )
    {
        fprintf( stdout, "Io_WriteBenchLut(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n" );
        return 0;
    }
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBench(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the network
    Io_WriteBenchLutOne( pFile, pNtk );
    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
        printf( "Io_WriteBench: EXDC is not written (warning).\n" );
    // finalize the file
    fclose( pFile );
    return 1;
}